

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

size_t webrtc::WriteInt16BufferToFile(FileWrapper *file,size_t length,int16_t *buffer)

{
  uchar uVar1;
  uint uVar2;
  uchar *__p;
  type puVar3;
  pointer puVar4;
  FileWrapper *local_38;
  size_t int16s_written;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> byte_array;
  int16_t *buffer_local;
  size_t length_local;
  FileWrapper *file_local;
  
  if ((((file == (FileWrapper *)0x0) ||
       (byte_array._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
        _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             buffer, uVar2 = (*(file->super_InStream)._vptr_InStream[4])(), (uVar2 & 1) == 0)) ||
      ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
       byte_array._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
       _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0)) || (length == 0)
     ) {
    file_local = (FileWrapper *)0x0;
  }
  else {
    __p = (uchar *)operator_new__(2);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&int16s_written,
               __p);
    for (local_38 = (FileWrapper *)0x0; local_38 < length;
        local_38 = (FileWrapper *)((long)&(local_38->super_InStream)._vptr_InStream + 1)) {
      uVar1 = *(uchar *)((long)byte_array._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                        (long)local_38 * 2);
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &int16s_written,0);
      *puVar3 = uVar1;
      uVar1 = *(uchar *)((long)byte_array._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1 +
                        (long)local_38 * 2);
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &int16s_written,1);
      *puVar3 = uVar1;
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &int16s_written);
      (**(file->super_OutStream)._vptr_OutStream)(&file->super_OutStream,puVar4,2);
    }
    (*(file->super_InStream)._vptr_InStream[9])();
    file_local = local_38;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&int16s_written
              );
  }
  return (size_t)file_local;
}

Assistant:

size_t WriteInt16BufferToFile(FileWrapper* file,
                              size_t length,
                              const int16_t* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<uint8_t[]> byte_array(new uint8_t[2]);

  size_t int16s_written = 0;

  for (int16s_written = 0; int16s_written < length; ++int16s_written) {
    // Get byte representation.
    byte_array[0] = buffer[int16s_written] & 0xFF;
    byte_array[1] = (buffer[int16s_written] >> 8) & 0xFF;

    file->Write(byte_array.get(), 2);
  }

  file->Flush();

  return int16s_written;
}